

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

void Curl_client_cleanup(Curl_easy *data)

{
  ulong local_20;
  size_t i;
  Curl_cwriter *writer;
  Curl_easy *data_local;
  
  i = (size_t)(data->req).writer_stack;
  while (i != 0) {
    (data->req).writer_stack = *(Curl_cwriter **)(i + 8);
    (**(code **)(*(long *)i + 0x20))(data,i);
    (*Curl_cfree)((void *)i);
    i = (size_t)(data->req).writer_stack;
  }
  for (local_20 = 0; local_20 < (data->state).tempcount; local_20 = local_20 + 1) {
    Curl_dyn_free(&(data->state).tempwrite[local_20].b);
  }
  (data->state).tempcount = 0;
  (data->req).bytecount = 0;
  (data->req).headerline = 0;
  return;
}

Assistant:

void Curl_client_cleanup(struct Curl_easy *data)
{
  struct Curl_cwriter *writer = data->req.writer_stack;
  size_t i;

  while(writer) {
    data->req.writer_stack = writer->next;
    writer->cwt->do_close(data, writer);
    free(writer);
    writer = data->req.writer_stack;
  }

  for(i = 0; i < data->state.tempcount; i++) {
    Curl_dyn_free(&data->state.tempwrite[i].b);
  }
  data->state.tempcount = 0;
  data->req.bytecount = 0;
  data->req.headerline = 0;
}